

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
vk::enumerateDeviceExtensionProperties
          (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice,
          char *layerName)

{
  char *pcVar1;
  char *pcVar2;
  VkPhysicalDevice pVVar3;
  VkResult VVar4;
  deBool dVar5;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  TestError *this;
  uint local_30;
  undefined1 local_29;
  deUint32 numExtensions;
  char *layerName_local;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *properties;
  
  local_29 = 0;
  _numExtensions = layerName;
  layerName_local = (char *)physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vki;
  vki_local = (InstanceInterface *)__return_storage_ptr__;
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::vector
            (__return_storage_ptr__);
  local_30 = 0;
  VVar4 = (**(code **)(*(long *)physicalDevice_local + 0x50))
                    (physicalDevice_local,layerName_local,_numExtensions,&local_30,0);
  checkResult(VVar4,
              "vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, DE_NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xe4);
  if (local_30 != 0) {
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_30);
    pVVar3 = physicalDevice_local;
    pcVar2 = layerName_local;
    pcVar1 = _numExtensions;
    pvVar6 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
             operator[](__return_storage_ptr__,0);
    VVar4 = (**(code **)(*(long *)pVVar3 + 0x50))(pVVar3,pcVar2,pcVar1,&local_30,pvVar6);
    checkResult(VVar4,
                "vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, &properties[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0xe9);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) ||
         (uVar7 = (ulong)local_30,
         sVar8 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 ::size(__return_storage_ptr__), uVar7 != sVar8)) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,"(size_t)numExtensions == properties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                   ,0xea);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkExtensionProperties> enumerateDeviceExtensionProperties (const InstanceInterface& vki, VkPhysicalDevice physicalDevice, const char* layerName)
{
	vector<VkExtensionProperties>	properties;
	deUint32						numExtensions	= 0;

	VK_CHECK(vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, DE_NULL));

	if (numExtensions > 0)
	{
		properties.resize(numExtensions);
		VK_CHECK(vki.enumerateDeviceExtensionProperties(physicalDevice, layerName, &numExtensions, &properties[0]));
		TCU_CHECK((size_t)numExtensions == properties.size());
	}

	return properties;
}